

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O0

uc_afl_ret
uc_afl_fuzz(uc_engine *uc,char *input_file,uc_afl_cb_place_input_t place_input_callback,
           uint64_t *exits,size_t exit_count,uc_afl_cb_validate_crash_t validate_crash_callback,
           bool always_validate,uint32_t persistent_iters,void *data)

{
  uc_afl_ret uVar1;
  double __x;
  double __x_00;
  undefined1 local_f8 [8];
  UCAFL ucafl;
  bool always_validate_local;
  uc_afl_cb_validate_crash_t validate_crash_callback_local;
  size_t exit_count_local;
  uint64_t *exits_local;
  uc_afl_cb_place_input_t place_input_callback_local;
  char *input_file_local;
  uc_engine *uc_local;
  
  ucafl.h4_._7_1_ = always_validate;
  log_init();
  __x_00 = log(__x);
  if (uc == (uc_engine *)0x0) {
    log(__x_00);
    uc_local._4_4_ = UC_AFL_RET_ERROR;
  }
  else if ((input_file == (char *)0x0) || (*input_file == '\0')) {
    log(__x_00);
    uc_local._4_4_ = UC_AFL_RET_ERROR;
  }
  else if (place_input_callback == (uc_afl_cb_place_input_t)0x0) {
    log(__x_00);
    uc_local._4_4_ = UC_AFL_RET_ERROR;
  }
  else if (((ucafl.h4_._7_1_ & 1) == 0) ||
          (validate_crash_callback != (uc_afl_cb_validate_crash_t)0x0)) {
    if (exit_count == 0) {
      log(__x_00);
      uc_local._4_4_ = UC_AFL_RET_ERROR;
    }
    else {
      UCAFL::UCAFL((UCAFL *)local_f8,uc,input_file,place_input_callback,validate_crash_callback,
                   dummy_uc_afl_fuzz_callback,(bool)(ucafl.h4_._7_1_ & 1),persistent_iters,data);
      uVar1 = UCAFL::set_exits((UCAFL *)local_f8,exits,exit_count);
      if (uVar1 == UC_AFL_RET_OK) {
        uc_local._4_4_ = UCAFL::fsrv_run((UCAFL *)local_f8);
      }
      else {
        uc_local._4_4_ = UC_AFL_RET_ERROR;
      }
      UCAFL::~UCAFL((UCAFL *)local_f8);
    }
  }
  else {
    log(__x_00);
    uc_local._4_4_ = UC_AFL_RET_ERROR;
  }
  return uc_local._4_4_;
}

Assistant:

UNICORNAFL_EXPORT uc_afl_ret uc_afl_fuzz(
    uc_engine* uc, char* input_file,
    uc_afl_cb_place_input_t place_input_callback, uint64_t* exits,
    size_t exit_count, uc_afl_cb_validate_crash_t validate_crash_callback,
    bool always_validate, uint32_t persistent_iters, void* data) {

    log_init();

    ERR("Entering uc_afl_fuzz with input_file=%s and persistent_iters=%" PRIu32
        "\n",
        input_file, persistent_iters);
    // Sanity Check.
    if (!uc) {
        ERR("Unicorn Engine passed to uc_afl_fuzz is NULL!\n");
        return UC_AFL_RET_ERROR;
    }
    if (!input_file || input_file[0] == 0) {
        ERR("No input file provided to uc_afl_fuzz.\n");
        return UC_AFL_RET_ERROR;
    }
    if (!place_input_callback) {
        ERR("no place_input_callback set.\n");
        return UC_AFL_RET_ERROR;
    }
    if (always_validate && !validate_crash_callback) {
        ERR("always_validate set but validate_crash_callback is missing.\n");
        return UC_AFL_RET_ERROR;
    }
    if (!exit_count) {
        ERR("Nullptr provided for exits.\n");
        return UC_AFL_RET_ERROR;
    }

    UCAFL ucafl(uc, input_file, place_input_callback, validate_crash_callback,
                dummy_uc_afl_fuzz_callback, always_validate, persistent_iters,
                data);

    if (unlikely(ucafl.set_exits(exits, exit_count))) {
        return UC_AFL_RET_ERROR;
    }

    return ucafl.fsrv_run();
}